

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool ShaderProgramCreate(ShaderProgram *shader_program,string *fragment_source,string *vertex_source
                        ,string *error)

{
  GLuint GVar1;
  bool bVar2;
  GLint is_linked;
  string shader_prelude;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"#version 150\n",(allocator<char> *)&local_94);
  std::operator+(&local_70,&local_50,vertex_source);
  GVar1 = ShaderProgramCompile(&local_70,0x8b31,error);
  shader_program->VertexShaderHandle = GVar1;
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_90,&local_50,fragment_source);
  GVar1 = ShaderProgramCompile(&local_90,0x8b30,error);
  shader_program->FragmentShaderHandle = GVar1;
  std::__cxx11::string::~string((string *)&local_90);
  if ((shader_program->FragmentShaderHandle == 0) || (shader_program->VertexShaderHandle == 0)) {
    ShaderProgramDestroy(shader_program);
    bVar2 = false;
  }
  else {
    GVar1 = (*glad_glCreateProgram)();
    shader_program->Handle = GVar1;
    (*glad_glAttachShader)(GVar1,shader_program->VertexShaderHandle);
    (*glad_glAttachShader)(shader_program->Handle,shader_program->FragmentShaderHandle);
    (*glad_glLinkProgram)(shader_program->Handle);
    (*glad_glDeleteShader)(shader_program->FragmentShaderHandle);
    (*glad_glDeleteShader)(shader_program->VertexShaderHandle);
    (*glad_glGetProgramiv)(shader_program->Handle,0x8b82,&local_94);
    bVar2 = local_94 != 0;
    if (!bVar2) {
      std::__cxx11::string::assign((char *)error);
      ShaderProgramDestroy(shader_program);
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool ShaderProgramCreate(ShaderProgram& shader_program, const std::string& fragment_source, const std::string& vertex_source, std::string& error) {
    std::string shader_prelude = "#version 150\n";

    shader_program.VertexShaderHandle = ShaderProgramCompile(shader_prelude + vertex_source, GL_VERTEX_SHADER, error);
    shader_program.FragmentShaderHandle = ShaderProgramCompile(shader_prelude + fragment_source, GL_FRAGMENT_SHADER, error);

    if (!shader_program.FragmentShaderHandle || !shader_program.VertexShaderHandle) {
        ShaderProgramDestroy(shader_program);
        return false;
    }

    shader_program.Handle = glCreateProgram();

    glAttachShader(shader_program.Handle, shader_program.VertexShaderHandle);
    glAttachShader(shader_program.Handle, shader_program.FragmentShaderHandle);

    glLinkProgram(shader_program.Handle);

    glDeleteShader(shader_program.FragmentShaderHandle);
    glDeleteShader(shader_program.VertexShaderHandle);

    GLint is_linked;
    glGetProgramiv(shader_program.Handle, GL_LINK_STATUS, &is_linked);

    if (is_linked == GL_FALSE) {
        error = "Error linking program";
        ShaderProgramDestroy(shader_program);
        return false;
    }

    return true;
}